

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O3

char * hist_lev_name(d_level *l,boolean in_or_on)

{
  undefined4 uVar1;
  boolean bVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  if (l->dnum == dungeon_topology.d_astral_level.dnum) {
    bVar2 = on_level(l,&dungeon_topology.d_astral_level);
    if (bVar2 == '\0') {
      bVar2 = on_level(l,&dungeon_topology.d_earth_level);
      if (bVar2 == '\0') {
        bVar2 = on_level(l,&dungeon_topology.d_air_level);
        if (bVar2 == '\0') {
          bVar2 = on_level(l,&dungeon_topology.d_fire_level);
          if (bVar2 == '\0') {
            bVar2 = on_level(l,&dungeon_topology.d_water_level);
            if (bVar2 == '\0') {
              sprintf(hist_lev_name::hlnbuf,"on the Plane of %d",(ulong)(uint)(int)l->dlevel);
            }
            else {
              builtin_strncpy(hist_lev_name::hlnbuf,"on the Plane of Water",0x16);
            }
          }
          else {
            builtin_strncpy(hist_lev_name::hlnbuf,"on the Plane of Fire",0x15);
          }
        }
        else {
          builtin_strncpy(hist_lev_name::hlnbuf,"on the Plane of Air",0x14);
        }
        goto LAB_001aed23;
      }
    }
    builtin_strncpy(hist_lev_name::hlnbuf,"on the Astral Plane",0x14);
  }
  else {
    bVar2 = on_level(l,&dungeon_topology.d_knox_level);
    uVar1 = hist_lev_name::hlnbuf._10_4_;
    if (bVar2 == '\0') {
      bVar2 = on_level(l,&dungeon_topology.d_stronghold_level);
      if (bVar2 == '\0') {
        bVar2 = on_level(l,&dungeon_topology.d_valley_level);
        if (bVar2 == '\0') {
          sprintf(hist_lev_name::hlnbuf,"on level %d of %s",(ulong)(uint)(int)l->dlevel,
                  dungeons + l->dnum);
        }
        else {
          builtin_strncpy(hist_lev_name::hlnbuf + 0x10," the Dead",10);
          builtin_strncpy(hist_lev_name::hlnbuf,"in The Valley of",0x10);
        }
        goto LAB_001aed23;
      }
      builtin_strncpy(hist_lev_name::hlnbuf + 8,"astle",6);
      uVar3 = 0x4320656854206e69;
    }
    else {
      builtin_strncpy(hist_lev_name::hlnbuf + 8,"Knox",5);
      hist_lev_name::hlnbuf[0xd] = SUB41(uVar1,3);
      uVar3 = 0x2074726f46206e69;
    }
    hist_lev_name::hlnbuf._0_5_ = (undefined5)uVar3;
    hist_lev_name::hlnbuf[5] = (char)((ulong)uVar3 >> 0x28);
    hist_lev_name::hlnbuf._6_2_ = (undefined2)((ulong)uVar3 >> 0x30);
  }
LAB_001aed23:
  pcVar4 = hist_lev_name::hlnbuf;
  if (in_or_on == '\0') {
    pcVar4 = hist_lev_name::hlnbuf + 3;
  }
  return pcVar4;
}

Assistant:

const char *hist_lev_name(const d_level *l, boolean in_or_on)
{
    static char hlnbuf[BUFSZ];
    char *bufptr;
    
    if (In_endgame(l)) {
	if      (Is_astralevel(l))	strcpy(hlnbuf, "on the Astral Plane");
	else if (Is_earthlevel(l))	strcpy(hlnbuf, "on the Astral Plane");
	else if (Is_airlevel(l))	strcpy(hlnbuf, "on the Plane of Air");
	else if (Is_firelevel(l))	strcpy(hlnbuf, "on the Plane of Fire");
	else if (Is_waterlevel(l))	strcpy(hlnbuf, "on the Plane of Water");
	else sprintf(hlnbuf, "on the Plane of %d", l->dlevel);
    }
    else if (Is_knox(l))
	strcpy(hlnbuf, "in Fort Knox");
    else if (Is_stronghold(l))
	strcpy(hlnbuf, "in The Castle");
    else if (Is_valley(l))
	strcpy(hlnbuf, "in The Valley of the Dead");
    else
	sprintf(hlnbuf, "on level %d of %s", l->dlevel, dungeons[l->dnum].dname);
    
    bufptr = in_or_on? hlnbuf : (hlnbuf + 3);
    return bufptr;
}